

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_malloc.c
# Opt level: O2

void * opj_aligned_alloc_n(size_t alignment,size_t size)

{
  int iVar1;
  void *in_RAX;
  void *ptr;
  
  if (alignment == 0) {
    return (void *)0x0;
  }
  ptr = in_RAX;
  iVar1 = posix_memalign(&ptr,0x10,alignment);
  if (iVar1 != 0) {
    ptr = (void *)0x0;
  }
  return ptr;
}

Assistant:

static INLINE void *opj_aligned_alloc_n(size_t alignment, size_t size)
{
  void* ptr;

  /* alignment shall be power of 2 */
  assert( (alignment != 0U) && ((alignment & (alignment - 1U)) == 0U));
  /* alignment shall be at least sizeof(void*) */
  assert( alignment >= sizeof(void*));

  if (size == 0U) { /* prevent implementation defined behavior of realloc */
    return NULL;
  }

#if defined(OPJ_HAVE_POSIX_MEMALIGN)
  /* aligned_alloc requires c11, restrict to posix_memalign for now. Quote:
   * This function was introduced in POSIX 1003.1d. Although this function is
   * superseded by aligned_alloc, it is more portable to older POSIX systems
   * that do not support ISO C11.  */
  if (posix_memalign (&ptr, alignment, size))
  {
    ptr = NULL;
  }
  /* older linux */
#elif defined(OPJ_HAVE_MEMALIGN)
  ptr = memalign( alignment, size );
/* _MSC_VER */
#elif defined(OPJ_HAVE__ALIGNED_MALLOC)
  ptr = _aligned_malloc(size, alignment);
#else
  /*
   * Generic aligned malloc implementation.
   * Uses size_t offset for the integer manipulation of the pointer,
   * as uintptr_t is not available in C89 to do
   * bitwise operations on the pointer itself.
   */
  alignment--;
  {
    size_t offset;
    OPJ_UINT8 *mem;

    /* Room for padding and extra pointer stored in front of allocated area */
    size_t overhead = alignment + sizeof(void *);

    /* let's be extra careful */
    assert(alignment <= (SIZE_MAX - sizeof(void *)));

    /* Avoid integer overflow */
    if (size > (SIZE_MAX - overhead)) {
      return NULL;
    }

    mem = (OPJ_UINT8*)malloc(size + overhead);
    if (mem == NULL) {
      return mem;
    }
    /* offset = ((alignment + 1U) - ((size_t)(mem + sizeof(void*)) & alignment)) & alignment; */
    /* Use the fact that alignment + 1U is a power of 2 */
    offset = ((alignment ^ ((size_t)(mem + sizeof(void*)) & alignment)) + 1U) & alignment;
    ptr = (void *)(mem + sizeof(void*) + offset);
    ((void**) ptr)[-1] = mem;
  }
#endif
  return ptr;
}